

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O3

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiAnimation *pAnimation)

{
  aiNodeAnim *pNodeAnim;
  uint uVar1;
  ulong uVar2;
  
  Validate(this,&pAnimation->mName);
  if (pAnimation->mNumChannels == 0) {
    ReportError(this,
                "aiAnimation::mNumChannels is 0. At least one node animation channel must be there."
               );
  }
  if (pAnimation->mChannels != (aiNodeAnim **)0x0) {
    pNodeAnim = *pAnimation->mChannels;
    if (pNodeAnim == (aiNodeAnim *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar2 = 1;
      do {
        Validate(this,pAnimation,pNodeAnim);
        if (pAnimation->mNumChannels <= uVar2) {
          return;
        }
        pNodeAnim = pAnimation->mChannels[uVar2];
        uVar2 = uVar2 + 1;
      } while (pNodeAnim != (aiNodeAnim *)0x0);
      uVar1 = (int)uVar2 - 1;
    }
    ReportError(this,"aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
                (ulong)uVar1);
  }
  ReportError(this,"aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",
              (ulong)pAnimation->mNumChannels);
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation)
{
    Validate(&pAnimation->mName);

    // validate all materials
    if (pAnimation->mNumChannels)
    {
        if (!pAnimation->mChannels) {
            ReportError("aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",
                pAnimation->mNumChannels);
        }
        for (unsigned int i = 0; i < pAnimation->mNumChannels;++i)
        {
            if (!pAnimation->mChannels[i])
            {
                ReportError("aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
                    i, pAnimation->mNumChannels);
            }
            Validate(pAnimation, pAnimation->mChannels[i]);
        }
    }
    else {
    	ReportError("aiAnimation::mNumChannels is 0. At least one node animation channel must be there.");
    }
}